

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_PrintDiv(Fx_Man_t *p,int iDiv)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  abctime aVar3;
  float fVar4;
  int local_18;
  int i;
  int iDiv_local;
  Fx_Man_t *p_local;
  
  printf("%4d : ",(ulong)(uint)p->nDivs);
  printf("Div %7d : ",(ulong)(uint)iDiv);
  fVar4 = Vec_FltEntry(p->vWeights,iDiv);
  printf("Weight %12.5f  ",(double)fVar4);
  pVVar2 = Hsh_VecReadEntry(p->pHash,iDiv);
  Fx_PrintDivOne(pVVar2);
  pVVar2 = Hsh_VecReadEntry(p->pHash,iDiv);
  local_18 = Vec_IntSize(pVVar2);
  for (local_18 = local_18 + 3; local_18 < 0x10; local_18 = local_18 + 1) {
    printf(" ");
  }
  printf("Lits =%7d  ",(ulong)(uint)p->nLits);
  uVar1 = Hsh_VecSize(p->pHash);
  printf("Divs =%8d  ",(ulong)uVar1);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - p->timeStart);
  return;
}

Assistant:

static inline void Fx_PrintDiv( Fx_Man_t * p, int iDiv )
{
    int i;
    printf( "%4d : ", p->nDivs );
    printf( "Div %7d : ", iDiv );
    printf( "Weight %12.5f  ", Vec_FltEntry(p->vWeights, iDiv) );
//    printf( "Compl %4d  ", p->nCompls );
    Fx_PrintDivOne( Hsh_VecReadEntry(p->pHash, iDiv) );
    for ( i = Vec_IntSize(Hsh_VecReadEntry(p->pHash, iDiv)) + 3; i < 16; i++ )
        printf( " " );
    printf( "Lits =%7d  ", p->nLits );
    printf( "Divs =%8d  ", Hsh_VecSize(p->pHash) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->timeStart );
}